

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

result * __thiscall
lest::expression_lhs<std::byte_const&>::operator!=
          (expression_lhs<const_std::byte_&> *this,byte *rhs)

{
  undefined8 *in_RSI;
  result *in_RDI;
  byte *in_stack_00000168;
  string *in_stack_00000170;
  byte *in_stack_00000178;
  bool *passed_;
  result *this_00;
  allocator<char> local_61;
  allocator<char> *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  
  passed_ = (bool *)*in_RSI;
  this_00 = (result *)&local_61;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  to_string<std::byte,std::byte>(in_stack_00000178,in_stack_00000170,in_stack_00000168);
  result::result<bool>(this_00,passed_,(text *)in_RDI);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  std::allocator<char>::~allocator(&local_61);
  return in_RDI;
}

Assistant:

result operator<=( R const & rhs ) { return result( lhs <= rhs, to_string( lhs, "<=", rhs ) ); }